

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printdfd.c
# Opt level: O0

char * dfdToStringColorPrimaries(khr_df_primaries_e value)

{
  khr_df_primaries_e value_local;
  char *local_8;
  
  if (value == KHR_DF_PRIMARIES_UNSPECIFIED) {
    local_8 = "KHR_DF_PRIMARIES_UNSPECIFIED";
  }
  else if (value == KHR_DF_PRIMARIES_BT709) {
    local_8 = "KHR_DF_PRIMARIES_BT709";
  }
  else if (value == KHR_DF_PRIMARIES_BT601_EBU) {
    local_8 = "KHR_DF_PRIMARIES_BT601_EBU";
  }
  else if (value == KHR_DF_PRIMARIES_BT601_SMPTE) {
    local_8 = "KHR_DF_PRIMARIES_BT601_SMPTE";
  }
  else if (value == KHR_DF_PRIMARIES_BT2020) {
    local_8 = "KHR_DF_PRIMARIES_BT2020";
  }
  else if (value == KHR_DF_PRIMARIES_CIEXYZ) {
    local_8 = "KHR_DF_PRIMARIES_CIEXYZ";
  }
  else if (value == KHR_DF_PRIMARIES_ACES) {
    local_8 = "KHR_DF_PRIMARIES_ACES";
  }
  else if (value == KHR_DF_PRIMARIES_ACESCC) {
    local_8 = "KHR_DF_PRIMARIES_ACESCC";
  }
  else if (value == KHR_DF_PRIMARIES_NTSC1953) {
    local_8 = "KHR_DF_PRIMARIES_NTSC1953";
  }
  else if (value == KHR_DF_PRIMARIES_PAL525) {
    local_8 = "KHR_DF_PRIMARIES_PAL525";
  }
  else if (value == KHR_DF_PRIMARIES_DISPLAYP3) {
    local_8 = "KHR_DF_PRIMARIES_DISPLAYP3";
  }
  else if (value == KHR_DF_PRIMARIES_ADOBERGB) {
    local_8 = "KHR_DF_PRIMARIES_ADOBERGB";
  }
  else {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

const char* dfdToStringColorPrimaries(khr_df_primaries_e value) {
    switch (value) {
    case KHR_DF_PRIMARIES_UNSPECIFIED:
        return "KHR_DF_PRIMARIES_UNSPECIFIED";
    case KHR_DF_PRIMARIES_BT709:
    // case KHR_DF_PRIMARIES_SRGB: // Fallthrough, Matching values
        return "KHR_DF_PRIMARIES_BT709";
    case KHR_DF_PRIMARIES_BT601_EBU:
        return "KHR_DF_PRIMARIES_BT601_EBU";
    case KHR_DF_PRIMARIES_BT601_SMPTE:
        return "KHR_DF_PRIMARIES_BT601_SMPTE";
    case KHR_DF_PRIMARIES_BT2020:
        return "KHR_DF_PRIMARIES_BT2020";
    case KHR_DF_PRIMARIES_CIEXYZ:
        return "KHR_DF_PRIMARIES_CIEXYZ";
    case KHR_DF_PRIMARIES_ACES:
        return "KHR_DF_PRIMARIES_ACES";
    case KHR_DF_PRIMARIES_ACESCC:
        return "KHR_DF_PRIMARIES_ACESCC";
    case KHR_DF_PRIMARIES_NTSC1953:
        return "KHR_DF_PRIMARIES_NTSC1953";
    case KHR_DF_PRIMARIES_PAL525:
        return "KHR_DF_PRIMARIES_PAL525";
    case KHR_DF_PRIMARIES_DISPLAYP3:
        return "KHR_DF_PRIMARIES_DISPLAYP3";
    case KHR_DF_PRIMARIES_ADOBERGB:
        return "KHR_DF_PRIMARIES_ADOBERGB";

    case KHR_DF_PRIMARIES_MAX:
        // These enum values are not meant for string representation. Ignore
        break;
    }
    return NULL;
}